

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Fts3PendingTermsClear(Fts3Table *p)

{
  Fts3Index *pFVar1;
  Fts3HashElem *pFVar2;
  int i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 < p->nIndex; lVar3 = lVar3 + 1) {
    pFVar1 = p->aIndex;
    pFVar2 = (Fts3HashElem *)&pFVar1[lVar3].hPending.first;
    while (pFVar2 = pFVar2->next, pFVar2 != (Fts3HashElem *)0x0) {
      sqlite3_free(pFVar2->data);
    }
    sqlite3Fts3HashClear(&pFVar1[lVar3].hPending);
  }
  p->nPendingData = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3PendingTermsClear(Fts3Table *p){
  int i;
  for(i=0; i<p->nIndex; i++){
    Fts3HashElem *pElem;
    Fts3Hash *pHash = &p->aIndex[i].hPending;
    for(pElem=fts3HashFirst(pHash); pElem; pElem=fts3HashNext(pElem)){
      PendingList *pList = (PendingList *)fts3HashData(pElem);
      fts3PendingListDelete(pList);
    }
    fts3HashClear(pHash);
  }
  p->nPendingData = 0;
}